

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void __thiscall Fossilize::StateRecorder::Impl::~Impl(Impl *this)

{
  pointer puVar1;
  
  sync_thread(this);
  puVar1 = (this->record_data).blob.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->record_data).blob.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  if ((this->worker_thread)._M_id._M_thread == 0) {
    std::_Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>::~_Deque_base
              ((_Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_> *)
               &this->record_queue);
    std::condition_variable::~condition_variable(&this->record_cv);
    std::
    _Hashtable<VkShaderModuleIdentifierEXT,_std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::hash<VkShaderModuleIdentifierEXT>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&(this->identifier_to_module)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->render_pass_hash_to_subpass_meta)._M_h);
    std::
    _Hashtable<VkSampler_T_*,_std::pair<VkSampler_T_*const,_unsigned_long>,_std::allocator<std::pair<VkSampler_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkSampler_T_*>,_std::hash<VkSampler_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->sampler_to_hash)._M_h);
    std::
    _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_unsigned_long>,_std::allocator<std::pair<VkRenderPass_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->render_pass_to_hash)._M_h);
    std::
    _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->raytracing_pipeline_to_hash)._M_h);
    std::
    _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->compute_pipeline_to_hash)._M_h);
    std::
    _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->graphics_pipeline_to_hash)._M_h);
    std::
    _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->shader_module_to_hash)._M_h);
    std::
    _Hashtable<VkPipelineLayout_T_*,_std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipelineLayout_T_*>,_std::hash<VkPipelineLayout_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->pipeline_layout_to_hash)._M_h);
    std::
    _Hashtable<VkDescriptorSetLayout_T_*,_std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_std::allocator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkDescriptorSetLayout_T_*>,_std::hash<VkDescriptorSetLayout_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->descriptor_set_layout_to_hash)._M_h);
    std::
    _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->ycbcr_conversions)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->samplers)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_void_*>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->render_passes)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->raytracing_pipelines)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->compute_pipelines)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->graphics_pipelines)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->shader_modules)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->pipeline_layouts)._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->descriptor_sets)._M_h);
    ScratchAllocator::~ScratchAllocator(&this->ycbcr_temp_allocator);
    ScratchAllocator::~ScratchAllocator(&this->temp_allocator);
    ScratchAllocator::~ScratchAllocator(&this->allocator);
    return;
  }
  std::terminate();
}

Assistant:

StateRecorder::Impl::~Impl()
{
	sync_thread();
}